

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cport.cc
# Opt level: O0

void __thiscall rcg::CPort::Write(CPort *this,void *buffer,int64_t addr,int64_t length)

{
  GC_ERROR GVar1;
  element_type *peVar2;
  ostream *poVar3;
  void *pvVar4;
  undefined8 uVar5;
  size_t in_RCX;
  uint64_t in_RDX;
  void *in_RSI;
  long in_RDI;
  ostringstream out;
  size_t size;
  shared_ptr<const_rcg::GenTLWrapper> *in_stack_00000380;
  string *in_stack_00000388;
  GenTLException *in_stack_00000390;
  string *in_stack_fffffffffffffd88;
  allocator *msg;
  GenTLException *in_stack_fffffffffffffd90;
  allocator local_221;
  string local_220 [38];
  undefined1 local_1fa;
  allocator local_1f9;
  string local_1f8 [39];
  undefined1 local_1d1;
  ostringstream local_1a0 [376];
  size_t local_28;
  size_t local_20;
  uint64_t local_18;
  void *local_10;
  
  if (**(long **)(in_RDI + 0x18) == 0) {
    uVar5 = __cxa_allocate_exception(0x28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_220,"CPort::Write(): Port has been closed",&local_221);
    GenTLException::GenTLException(in_stack_fffffffffffffd90,in_stack_fffffffffffffd88);
    __cxa_throw(uVar5,&GenTLException::typeinfo,GenTLException::~GenTLException);
  }
  local_28 = in_RCX;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  peVar2 = std::
           __shared_ptr_access<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x121700);
  GVar1 = (*peVar2->GCWritePort)
                    ((PORT_HANDLE)**(undefined8 **)(in_RDI + 0x18),local_18,local_10,&local_28);
  if (GVar1 != 0) {
    std::__cxx11::ostringstream::ostringstream(local_1a0);
    poVar3 = std::operator<<((ostream *)local_1a0,"CPort::Write(address=0x");
    pvVar4 = (void *)std::ostream::operator<<(poVar3,std::hex);
    poVar3 = (ostream *)std::ostream::operator<<(pvVar4,local_18);
    poVar3 = std::operator<<(poVar3,", length=");
    pvVar4 = (void *)std::ostream::operator<<(poVar3,std::dec);
    poVar3 = (ostream *)std::ostream::operator<<(pvVar4,local_20);
    std::operator<<(poVar3,")");
    local_1d1 = 1;
    uVar5 = __cxa_allocate_exception(0x28);
    std::__cxx11::ostringstream::str();
    GenTLException::GenTLException(in_stack_00000390,in_stack_00000388,in_stack_00000380);
    local_1d1 = 0;
    __cxa_throw(uVar5,&GenTLException::typeinfo,GenTLException::~GenTLException);
  }
  if (local_28 != local_20) {
    local_1fa = 1;
    uVar5 = __cxa_allocate_exception(0x28);
    msg = &local_1f9;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1f8,"CPort::Write(): Returned size not as expected",msg);
    GenTLException::GenTLException(in_stack_fffffffffffffd90,(string *)msg);
    local_1fa = 0;
    __cxa_throw(uVar5,&GenTLException::typeinfo,GenTLException::~GenTLException);
  }
  return;
}

Assistant:

void CPort::Write(const void *buffer, int64_t addr, int64_t length)
{
  size_t size=static_cast<size_t>(length);

  if (*port != 0)
  {
    if (gentl->GCWritePort(*port, static_cast<uint64_t>(addr), buffer, &size) !=
        GenTL::GC_ERR_SUCCESS)
    {
      std::ostringstream out;
      out << "CPort::Write(address=0x" << std::hex << addr << ", length=" <<
        std::dec << length << ")";

      throw GenTLException(out.str(), gentl);
    }

    if (size != static_cast<size_t>(length))
    {
      throw GenTLException("CPort::Write(): Returned size not as expected");
    }
  }
  else
  {
    throw GenTLException("CPort::Write(): Port has been closed");
  }
}